

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void StatusServerHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,
                        attr_list attrs)

{
  ostream *poVar1;
  char *__s;
  long in_RCX;
  uint *in_RDX;
  undefined8 in_RSI;
  stringstream Status;
  char hostbuffer [256];
  _StatusResponseMsg status_response_msg;
  Remote_evpath_state *ev_state;
  StatusServerMsg status_msg;
  string local_350 [32];
  string local_330 [32];
  string local_310 [48];
  stringstream local_2e0 [16];
  ostream local_2d0 [296];
  uint64_t in_stack_fffffffffffffe58;
  char local_158 [256];
  ulong local_58;
  char *pcStack_50;
  char *local_48;
  long local_38;
  uint *local_30;
  undefined8 local_10;
  
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_10 = in_RSI;
  gethostname(local_158,0x100);
  local_48 = (char *)0x0;
  local_58 = (ulong)*local_30;
  pcStack_50 = local_158;
  std::__cxx11::stringstream::stringstream(local_2e0);
  poVar1 = std::operator<<(local_2d0,"ADIOS files Opened: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ADIOSFilesOpened);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,TotalGets);
  poVar1 = std::operator<<(poVar1," gets for ");
  readable_size_abi_cxx11_(in_stack_fffffffffffffe58);
  poVar1 = std::operator<<(poVar1,local_310);
  poVar1 = std::operator<<(poVar1,")  Simple files opened: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,SimpleFilesOpened);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,TotalSimpleReads);
  poVar1 = std::operator<<(poVar1," reads for ");
  readable_size_abi_cxx11_(in_stack_fffffffffffffe58);
  poVar1 = std::operator<<(poVar1,local_330);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::stringstream::str();
  __s = (char *)std::__cxx11::string::c_str();
  local_48 = strdup(__s);
  std::__cxx11::string::~string(local_350);
  CMwrite(local_10,*(undefined8 *)(local_38 + 0x60),&local_58);
  free(local_48);
  std::__cxx11::stringstream::~stringstream(local_2e0);
  return;
}

Assistant:

static void StatusServerHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                                attr_list attrs)
{
    StatusServerMsg status_msg = static_cast<StatusServerMsg>(vevent);
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    _StatusResponseMsg status_response_msg;
    char hostbuffer[256];

    // To retrieve hostname
    gethostname(hostbuffer, sizeof(hostbuffer));
    memset(&status_response_msg, 0, sizeof(status_response_msg));
    status_response_msg.StatusResponseCondition = status_msg->StatusResponseCondition;
    status_response_msg.Hostname = &hostbuffer[0];
    std::stringstream Status;
    Status << "ADIOS files Opened: " << ADIOSFilesOpened << " (" << TotalGets << " gets for "
           << readable_size(TotalGetBytesSent) << ")  Simple files opened: " << SimpleFilesOpened
           << " (" << TotalSimpleReads << " reads for " << readable_size(TotalSimpleBytesSent)
           << ")";
    status_response_msg.Status = strdup(Status.str().c_str());
    CMwrite(conn, ev_state->StatusResponseFormat, &status_response_msg);
    free(status_response_msg.Status);
}